

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::Parser::GenerateMapEntry
          (Parser *this,MapField *map_field,FieldDescriptorProto *field,
          RepeatedPtrField<google::protobuf::DescriptorProto> *messages)

{
  byte *pbVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>_> *this_00
  ;
  MessageOptions *pMVar6;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>_>
  *this_01;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>_>
  *this_02;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption>_>
  *from;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption_NamePart>_>
  *pVVar7;
  FieldOptions *pFVar8;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption>_>
  *pVVar9;
  long *plVar10;
  Arena *pAVar11;
  int i;
  int index;
  long lVar12;
  undefined1 *puVar13;
  RepeatedPtrField<google::protobuf::FieldDescriptorProto> *this_03;
  RepeatedPtrField<google::protobuf::UninterpretedOption_NamePart> *pRVar14;
  string entry_name;
  
  this_00 = protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>>
                      (&messages->super_RepeatedPtrFieldBase);
  plVar10 = (long *)((ulong)(field->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
  lVar3 = *plVar10;
  lVar4 = plVar10[1];
  entry_name._M_dataplus._M_p = (pointer)&entry_name.field_2;
  entry_name._M_string_length = 0;
  entry_name.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)&entry_name);
  for (lVar12 = 0; lVar4 != lVar12; lVar12 = lVar12 + 1) {
    if (*(char *)(lVar3 + lVar12) != '_') {
      std::__cxx11::string::push_back((char)&entry_name);
    }
  }
  std::__cxx11::string::append((char *)&entry_name);
  *(byte *)&field->field_0 = *(byte *)&field->field_0 | 4;
  pAVar11 = (Arena *)(field->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar11 & 1) != 0) {
    pAVar11 = *(Arena **)((ulong)pAVar11 & 0xfffffffffffffffe);
  }
  protobuf::internal::ArenaStringPtr::Set<>(&(field->field_0)._impl_.type_name_,&entry_name,pAVar11)
  ;
  *(byte *)&this_00->field_0 = *(byte *)&this_00->field_0 | 1;
  pAVar11 = (Arena *)(this_00->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar11 & 1) != 0) {
    pAVar11 = *(Arena **)((ulong)pAVar11 & 0xfffffffffffffffe);
  }
  protobuf::internal::ArenaStringPtr::Set<>(&(this_00->field_0)._impl_.name_,&entry_name,pAVar11);
  pMVar6 = DescriptorProto::mutable_options(this_00);
  (pMVar6->field_0)._impl_.map_entry_ = true;
  pbVar1 = (byte *)((long)&pMVar6->field_0 + 0x18);
  *pbVar1 = *pbVar1 | 0x10;
  this_03 = &(this_00->field_0)._impl_.field_;
  this_01 = protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                      (&this_03->super_RepeatedPtrFieldBase);
  *(byte *)&this_01->field_0 = *(byte *)&this_01->field_0 | 1;
  pAVar11 = (Arena *)(this_01->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar11 & 1) != 0) {
    pAVar11 = *(Arena **)((ulong)pAVar11 & 0xfffffffffffffffe);
  }
  protobuf::internal::ArenaStringPtr::Set(&(this_01->field_0)._impl_.name_,"key",pAVar11);
  FieldDescriptorProto::set_label(this_01,FieldDescriptorProto_Label_LABEL_OPTIONAL);
  (this_01->field_0)._impl_.number_ = 1;
  uVar2 = *(uint *)&this_01->field_0;
  (this_01->field_0)._impl_._has_bits_.has_bits_[0] = uVar2 | 0x40;
  if ((map_field->key_type_name)._M_string_length == 0) {
    FieldDescriptorProto::set_type(this_01,map_field->key_type);
  }
  else {
    (this_01->field_0)._impl_._has_bits_.has_bits_[0] = uVar2 | 0x44;
    pAVar11 = (Arena *)(this_01->super_Message).super_MessageLite._internal_metadata_.ptr_;
    if (((ulong)pAVar11 & 1) != 0) {
      pAVar11 = *(Arena **)((ulong)pAVar11 & 0xfffffffffffffffe);
    }
    protobuf::internal::ArenaStringPtr::Set<>
              (&(this_01->field_0)._impl_.type_name_,&map_field->key_type_name,pAVar11);
  }
  this_02 = protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                      (&this_03->super_RepeatedPtrFieldBase);
  *(byte *)&this_02->field_0 = *(byte *)&this_02->field_0 | 1;
  pAVar11 = (Arena *)(this_02->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar11 & 1) != 0) {
    pAVar11 = *(Arena **)((ulong)pAVar11 & 0xfffffffffffffffe);
  }
  protobuf::internal::ArenaStringPtr::Set(&(this_02->field_0)._impl_.name_,"value",pAVar11);
  FieldDescriptorProto::set_label(this_02,FieldDescriptorProto_Label_LABEL_OPTIONAL);
  (this_02->field_0)._impl_.number_ = 2;
  uVar2 = *(uint *)&this_02->field_0;
  (this_02->field_0)._impl_._has_bits_.has_bits_[0] = uVar2 | 0x40;
  if ((map_field->value_type_name)._M_string_length == 0) {
    FieldDescriptorProto::set_type(this_02,map_field->value_type);
  }
  else {
    (this_02->field_0)._impl_._has_bits_.has_bits_[0] = uVar2 | 0x44;
    pAVar11 = (Arena *)(this_02->super_Message).super_MessageLite._internal_metadata_.ptr_;
    if (((ulong)pAVar11 & 1) != 0) {
      pAVar11 = *(Arena **)((ulong)pAVar11 & 0xfffffffffffffffe);
    }
    protobuf::internal::ArenaStringPtr::Set<>
              (&(this_02->field_0)._impl_.type_name_,&map_field->value_type_name,pAVar11);
  }
  index = 0;
  while( true ) {
    puVar13 = (undefined1 *)(field->field_0)._impl_.options_;
    if ((FieldOptions *)puVar13 == (FieldOptions *)0x0) {
      puVar13 = _FieldOptions_default_instance_;
    }
    if (*(int *)((long)&((FieldOptions *)puVar13)->field_0 + 0x50) <= index) break;
    from = protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption>>
                     (&(((FieldOptions *)puVar13)->field_0)._impl_.uninterpreted_option_.
                       super_RepeatedPtrFieldBase,index);
    if (*(int *)((long)&from->field_0 + 0x10) == 1) {
      pRVar14 = &(from->field_0)._impl_.name_;
      pVVar7 = protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption_NamePart>>
                         (&pRVar14->super_RepeatedPtrFieldBase,0);
      bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((ulong)(pVVar7->field_0)._impl_.name_part_.tagged_ptr_.ptr_ &
                              0xfffffffffffffffc),"enforce_utf8");
      if ((bVar5) &&
         (pVVar7 = protobuf::internal::RepeatedPtrFieldBase::
                   Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption_NamePart>>
                             (&pRVar14->super_RepeatedPtrFieldBase,0),
         (pVVar7->field_0)._impl_.is_extension_ == false)) {
        if ((this_01->field_0)._impl_.type_ == 9) {
          pFVar8 = FieldDescriptorProto::mutable_options(this_01);
          pVVar9 = protobuf::internal::RepeatedPtrFieldBase::
                   Add<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption>>
                             (&(pFVar8->field_0)._impl_.uninterpreted_option_.
                               super_RepeatedPtrFieldBase);
          UninterpretedOption::CopyFrom(pVVar9,from);
        }
        if ((this_02->field_0)._impl_.type_ == 9) {
          pFVar8 = FieldDescriptorProto::mutable_options(this_02);
          pVVar9 = protobuf::internal::RepeatedPtrFieldBase::
                   Add<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption>>
                             (&(pFVar8->field_0)._impl_.uninterpreted_option_.
                               super_RepeatedPtrFieldBase);
          UninterpretedOption::CopyFrom(pVVar9,from);
        }
      }
    }
    pRVar14 = &(from->field_0)._impl_.name_;
    pVVar7 = protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption_NamePart>>
                       (&pRVar14->super_RepeatedPtrFieldBase,0);
    bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((ulong)(pVVar7->field_0)._impl_.name_part_.tagged_ptr_.ptr_ &
                            0xfffffffffffffffc),"features");
    if ((bVar5) &&
       (pVVar7 = protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption_NamePart>>
                           (&pRVar14->super_RepeatedPtrFieldBase,0),
       (pVVar7->field_0)._impl_.is_extension_ == false)) {
      pFVar8 = FieldDescriptorProto::mutable_options(this_01);
      pVVar9 = protobuf::internal::RepeatedPtrFieldBase::
               Add<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption>>
                         (&(pFVar8->field_0)._impl_.uninterpreted_option_.super_RepeatedPtrFieldBase
                         );
      UninterpretedOption::CopyFrom(pVVar9,from);
      pFVar8 = FieldDescriptorProto::mutable_options(this_02);
      pVVar9 = protobuf::internal::RepeatedPtrFieldBase::
               Add<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption>>
                         (&(pFVar8->field_0)._impl_.uninterpreted_option_.super_RepeatedPtrFieldBase
                         );
      UninterpretedOption::CopyFrom(pVVar9,from);
    }
    index = index + 1;
  }
  std::__cxx11::string::~string((string *)&entry_name);
  return;
}

Assistant:

void Parser::GenerateMapEntry(const MapField& map_field,
                              FieldDescriptorProto* field,
                              RepeatedPtrField<DescriptorProto>* messages) {
  DescriptorProto* entry = messages->Add();
  std::string entry_name = MapEntryName(field->name());
  field->set_type_name(entry_name);
  entry->set_name(entry_name);
  entry->mutable_options()->set_map_entry(true);
  FieldDescriptorProto* key_field = entry->add_field();
  key_field->set_name("key");
  key_field->set_label(FieldDescriptorProto::LABEL_OPTIONAL);
  key_field->set_number(1);
  if (map_field.key_type_name.empty()) {
    key_field->set_type(map_field.key_type);
  } else {
    key_field->set_type_name(map_field.key_type_name);
  }
  FieldDescriptorProto* value_field = entry->add_field();
  value_field->set_name("value");
  value_field->set_label(FieldDescriptorProto::LABEL_OPTIONAL);
  value_field->set_number(2);
  if (map_field.value_type_name.empty()) {
    value_field->set_type(map_field.value_type);
  } else {
    value_field->set_type_name(map_field.value_type_name);
  }
  // Propagate all features to the generated key and value fields. This helps
  // simplify the implementation of code generators and also reflection-based
  // parsing code. Instead of having to implement complex inheritance rules
  // special-casing maps, we can just copy them at generation time.
  //
  // The following definition:
  //   message Foo {
  //     map<string, string> value = 1 [features.some_feature = VALUE];
  //   }
  // will be interpreted as:
  //   message Foo {
  //     message ValueEntry {
  //       option map_entry = true;
  //       string key = 1 [features.some_feature = VALUE];
  //       string value = 2 [features.some_feature = VALUE];
  //     }
  //     repeated ValueEntry value = 1 [features.some_feature = VALUE];
  //  }
  for (int i = 0; i < field->options().uninterpreted_option_size(); ++i) {
    const UninterpretedOption& option =
        field->options().uninterpreted_option(i);
    // Legacy handling for the `enforce_utf8` option, which bears a striking
    // similarity to features in many respects.
    // TODO Delete this once proto2/proto3 have been turned down.
    if (option.name_size() == 1 &&
        option.name(0).name_part() == "enforce_utf8" &&
        !option.name(0).is_extension()) {
      if (key_field->type() == FieldDescriptorProto::TYPE_STRING) {
        *key_field->mutable_options()->add_uninterpreted_option() = option;
      }
      if (value_field->type() == FieldDescriptorProto::TYPE_STRING) {
        *value_field->mutable_options()->add_uninterpreted_option() = option;
      }
    }
    if (option.name(0).name_part() == "features" &&
        !option.name(0).is_extension()) {
      *key_field->mutable_options()->add_uninterpreted_option() = option;
      *value_field->mutable_options()->add_uninterpreted_option() = option;
    }
  }
}